

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyGen.cpp
# Opt level: O1

SequenceD<48> * __thiscall KeyGen::next(SequenceD<48> *__return_storage_ptr__,KeyGen *this)

{
  int iVar1;
  uint n;
  Permutation<56,_48> local_21;
  
  iVar1 = this->m_round;
  this->m_round = iVar1 + 1;
  n = SCHEDULED_LEFT_SHIFTS.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[iVar1];
  Sequence::shift(&(this->m_rolling).super_Sequence,n);
  (**(this->m_rolling).m_other._vptr_Sequence)(&(this->m_rolling).m_other,(ulong)n);
  Permutation<56,_48>::operator()(__return_storage_ptr__,&local_21,&this->m_rolling,&PC2);
  return __return_storage_ptr__;
}

Assistant:

SequenceD<48> KeyGen::next() {
    auto n = SCHEDULED_LEFT_SHIFTS[m_round++];
    m_rolling.shift(n);
    return Permutation<56, 48>{}(m_rolling, PC2);
}